

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O2

void __thiscall CharScanner::reportError(CharScanner *this,string *s)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  ostream *poVar4;
  
  iVar2 = (*(this->super_TokenStream)._vptr_TokenStream[0xc])();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar2),"");
  poVar4 = (ostream *)&std::cerr;
  if (bVar1) {
    pcVar3 = "Error: ";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in ");
    iVar2 = (*(this->super_TokenStream)._vptr_TokenStream[0xc])(this);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
    pcVar3 = ": ";
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,(string *)s);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void CharScanner::reportError(const std::string& s)
{
	if (getFilename() == "")
		std::cerr << "Error: " << s << std::endl;
	else
		std::cerr << "Error in " << getFilename() << ": " << s << std::endl;
}